

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routines.c
# Opt level: O0

void routine_register(routine *r)

{
  ulong uVar1;
  routine *r_local;
  
  if (r == (routine *)0x0) {
    abort();
  }
  if (r->name == (char *)0x0) {
    abort();
  }
  if (r->desc == (char *)0x0) {
    abort();
  }
  if (0xff < routine_cnt) {
    abort();
  }
  uVar1 = (ulong)routine_cnt;
  routine_cnt = routine_cnt + 1;
  routines[uVar1] = r;
  return;
}

Assistant:

void
routine_register(const struct routine *r)
{
	if (!r)
		abort();
	if (!r->name)
		abort();
	if (!r->desc)
		abort();
	if (routine_cnt >= ROUTINES_MAX)
		abort();
	routines[routine_cnt++] = r;
}